

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall cfd::TransactionContext::Verify(TransactionContext *this,OutPoint *outpoint)

{
  BlockHash *pBVar1;
  undefined1 uVar2;
  bool bVar3;
  uint uVar4;
  uint32_t vout;
  undefined8 uVar5;
  CfdException *this_00;
  OutPoint *in_RSI;
  UtxoData *in_RDI;
  function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *in_stack_00000030;
  AbstractTxIn *in_stack_00000038;
  UtxoData *in_stack_00000040;
  OutPoint *in_stack_00000048;
  TransactionContext *in_stack_00000050;
  OutPoint target_outpoint;
  TxIn *txin_ref;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *__range2;
  UtxoData work_utxo;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  value_type *txin;
  UtxoData utxo;
  undefined7 in_stack_fffffffffffff420;
  undefined1 in_stack_fffffffffffff427;
  UtxoData *in_stack_fffffffffffff428;
  string *in_stack_fffffffffffff430;
  function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *this_01;
  undefined8 in_stack_fffffffffffff438;
  CfdError CVar6;
  OutPoint *outpoint_00;
  CfdException *in_stack_fffffffffffff440;
  TransactionContext *in_stack_fffffffffffff448;
  allocator *paVar7;
  UtxoData *utxo_00;
  undefined7 in_stack_fffffffffffff490;
  undefined1 in_stack_fffffffffffff497;
  TransactionContext *in_stack_fffffffffffff498;
  Script local_b48;
  undefined1 local_b0a;
  allocator local_b09;
  string local_b08 [32];
  Txid local_ae8;
  OutPoint local_ac8;
  AbstractTxIn *local_aa0;
  __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_a98;
  __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_a90;
  ByteData *local_a88;
  Script local_a30;
  UtxoData *in_stack_fffffffffffff638;
  Script local_590;
  function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *local_540;
  undefined1 local_532;
  allocator local_531;
  string local_530 [48];
  UtxoData local_500;
  OutPoint *local_10;
  
  utxo_00 = &local_500;
  local_10 = in_RSI;
  UtxoData::UtxoData(in_RDI);
  uVar2 = IsFindUtxoMap(in_stack_fffffffffffff498,
                        (OutPoint *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                        utxo_00);
  CVar6 = (CfdError)((ulong)in_stack_fffffffffffff438 >> 0x20);
  if (!(bool)uVar2) {
    local_532 = 1;
    uVar5 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,"Utxo is not found. verify fail.",&local_531);
    core::CfdException::CfdException(in_stack_fffffffffffff440,CVar6,in_stack_fffffffffffff430);
    local_532 = 0;
    __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  pBVar1 = &in_RDI->block_hash;
  uVar4 = (**(code **)(in_RDI->block_height + 0x78))(in_RDI,local_10);
  local_540 = (function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
               *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                           ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                            &pBVar1->data_,(ulong)uVar4);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x50f0ea);
  GetLockingScriptFromUtxoData(in_stack_fffffffffffff638);
  core::Script::operator=(&local_500.locking_script,&local_590);
  core::Script::~Script((Script *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  bVar3 = core::Script::IsTaprootScript(&local_500.locking_script);
  if (bVar3) {
    UtxoData::UtxoData(in_RDI);
    local_a88 = &(in_RDI->block_hash).data_;
    local_a90._M_current =
         (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::begin
                           ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)local_a88);
    local_a98._M_current =
         (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::end
                           ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)local_a88);
    while (bVar3 = __gnu_cxx::operator!=(&local_a90,&local_a98), bVar3) {
      local_aa0 = &__gnu_cxx::
                   __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                   ::operator*(&local_a90)->super_AbstractTxIn;
      core::AbstractTxIn::GetTxid(&local_ae8,local_aa0);
      vout = core::AbstractTxIn::GetVout(local_aa0);
      core::OutPoint::OutPoint(&local_ac8,&local_ae8,vout);
      core::Txid::~Txid((Txid *)0x50f214);
      bVar3 = IsFindUtxoMap(in_stack_fffffffffffff498,
                            (OutPoint *)CONCAT17(uVar2,in_stack_fffffffffffff490),utxo_00);
      CVar6 = (CfdError)((ulong)in_stack_fffffffffffff438 >> 0x20);
      if (!bVar3) {
        local_b0a = 1;
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        paVar7 = &local_b09;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b08,"Utxo is not found. Verify fail.",paVar7);
        core::CfdException::CfdException(this_00,CVar6,in_stack_fffffffffffff430);
        local_b0a = 0;
        __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      GetLockingScriptFromUtxoData(in_stack_fffffffffffff638);
      core::Script::operator=(&local_a30,&local_b48);
      core::Script::~Script((Script *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420))
      ;
      std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
                ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_fffffffffffff430,
                 in_stack_fffffffffffff428);
      core::OutPoint::~OutPoint((OutPoint *)0x50f419);
      __gnu_cxx::
      __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
      ::operator++(&local_a90);
    }
    UtxoData::~UtxoData((UtxoData *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  }
  outpoint_00 = (OutPoint *)&stack0xfffffffffffff498;
  this_01 = local_540;
  std::
  function<cfd::core::ByteData256(cfd::TransactionContext_const*,cfd::core::OutPoint_const&,cfd::UtxoData_const&,cfd::core::SigHashType_const&,cfd::core::Pubkey_const&,cfd::core::Script_const&,cfd::core::WitnessVersion,cfd::core::ByteData_const*,cfd::core::TaprootScriptTree_const*)>
  ::
  function<cfd::core::ByteData256(&)(cfd::TransactionContext_const*,cfd::core::OutPoint_const&,cfd::UtxoData_const&,cfd::core::SigHashType_const&,cfd::core::Pubkey_const&,cfd::core::Script_const&,cfd::core::WitnessVersion,cfd::core::ByteData_const*,cfd::core::TaprootScriptTree_const*),void>
            (local_540,
             (_func_ByteData256_TransactionContext_ptr_OutPoint_ptr_UtxoData_ptr_SigHashType_ptr_Pubkey_ptr_Script_ptr_WitnessVersion_ByteData_ptr_TaprootScriptTree_ptr
              *)local_10);
  TransactionContextUtil::Verify<cfd::TransactionContext>
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
             in_stack_00000030);
  std::
  function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  ::~function((function<cfd::core::ByteData256_(const_cfd::TransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
               *)0x50f4df);
  uVar2 = IsFindOutPoint(in_stack_fffffffffffff448,
                         (vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                         in_stack_fffffffffffff440,outpoint_00);
  if (!(bool)uVar2) {
    std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
    emplace_back<cfd::core::OutPoint_const&>
              ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)this_01,local_10
              );
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_01);
  UtxoData::~UtxoData((UtxoData *)CONCAT17(uVar2,in_stack_fffffffffffff420));
  return;
}

Assistant:

void TransactionContext::Verify(const OutPoint& outpoint) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. verify fail.");
  }
  const auto& txin = vin_[GetTxInIndex(outpoint)];

  std::vector<UtxoData> utxo_list;
  utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
  if (utxo.locking_script.IsTaprootScript()) {
    UtxoData work_utxo;
    for (const auto& txin_ref : vin_) {
      OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
      if (!IsFindUtxoMap(target_outpoint, &work_utxo)) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Utxo is not found. Verify fail.");
      }
      work_utxo.locking_script = GetLockingScriptFromUtxoData(work_utxo);
      utxo_list.emplace_back(work_utxo);
    }
  }
  TransactionContextUtil::Verify<TransactionContext>(
      this, outpoint, utxo, &txin, CreateTxSighash);
  if (!IsFindOutPoint(verify_map_, outpoint)) {
    verify_map_.emplace_back(outpoint);
  }
}